

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

lua_Number lua_tonumberx(lua_State *L,int idx,int *ok)

{
  int iVar1;
  TValue local_40;
  TValue tmp;
  cTValue *o;
  int *ok_local;
  lua_State *plStack_20;
  int idx_local;
  lua_State *L_local;
  
  o = (cTValue *)ok;
  ok_local._4_4_ = idx;
  plStack_20 = L;
  tmp = (TValue)index2adr(L,idx);
  if ((uint)((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)tmp).it >> 0xf) < 0xfffffff3) {
    if (o != (cTValue *)0x0) {
      (o->field_4).i = 1;
    }
    L_local = *(lua_State **)tmp;
  }
  else {
    if (((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)tmp).it >> 0xf == -5) &&
       (iVar1 = lj_strscan_num((GCstr *)(*(ulong *)tmp & 0x7fffffffffff),&local_40), iVar1 != 0)) {
      if (o != (cTValue *)0x0) {
        (o->field_4).i = 1;
      }
      return (lua_Number)local_40.u64;
    }
    if (o != (cTValue *)0x0) {
      (o->field_4).i = 0;
    }
    L_local = (lua_State *)0x0;
  }
  return (lua_Number)L_local;
}

Assistant:

LUA_API lua_Number lua_tonumberx(lua_State *L, int idx, int *ok)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o))) {
    if (ok) *ok = 1;
    return numberVnum(o);
  } else if (tvisstr(o) && lj_strscan_num(strV(o), &tmp)) {
    if (ok) *ok = 1;
    return numV(&tmp);
  } else {
    if (ok) *ok = 0;
    return 0;
  }
}